

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

void __thiscall gutil::Properties::putValue<long>(Properties *this,char *key,long *value)

{
  ostringstream out;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<long>((long)local_198);
  std::__cxx11::stringbuf::str();
  putString(this,key,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }